

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::GetSegmentList(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                 *this,PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined8 *in_FS_OFFSET;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *local_40;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *local_38;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *local_30;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *local_28;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_local;
  
  uVar3 = (*this->_vptr_PageAllocatorBase[3])();
  if ((uVar3 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x5e5,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  bVar2 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsAllDecommitted(segment);
  if (bVar2) {
    local_28 = (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                *)0x0;
  }
  else {
    bVar2 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsFull(segment);
    if (bVar2) {
      local_30 = &this->fullSegments;
    }
    else {
      bVar2 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ShouldBeInDecommittedList
                        (segment);
      if (bVar2) {
        local_38 = &this->decommitSegments;
      }
      else {
        bVar2 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsEmpty(segment);
        if (bVar2) {
          local_40 = &this->emptySegments;
        }
        else {
          local_40 = &this->segments;
        }
        local_38 = local_40;
      }
      local_30 = local_38;
    }
    local_28 = local_30;
  }
  return local_28;
}

Assistant:

DListBase<TPageSegment> *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::GetSegmentList(TPageSegment * segment)
{
    Assert(!this->HasMultiThreadAccess());

    return
        (segment->IsAllDecommitted()) ? nullptr :
        (segment->IsFull()) ? &fullSegments :
        (segment->ShouldBeInDecommittedList()) ? &decommitSegments :
        (segment->IsEmpty()) ? &emptySegments :
        &segments;
}